

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzhamtest.cpp
# Opt level: O0

int simple_test(ilzham *lzham_dll,comp_options *options)

{
  uint uVar1;
  int iVar2;
  undefined4 *in_RSI;
  long in_RDI;
  lzham_decompress_status_t decomp_status;
  lzham_uint32 decomp_adler32;
  size_t decomp_size;
  lzham_uint8 decomp_buf [1024];
  lzham_decompress_params decomp_params;
  lzham_compress_status_t comp_status;
  lzham_uint32 comp_adler32;
  size_t uncomp_len;
  char *p;
  size_t cmp_len;
  lzham_uint8 cmp_buf [1024];
  lzham_compress_params comp_params;
  int local_874;
  size_t local_870;
  undefined1 local_868 [1024];
  undefined4 local_468;
  undefined4 local_464;
  uint local_45c;
  uint local_458;
  int local_454;
  ulong local_450;
  char *local_448;
  ulong local_440;
  undefined1 local_438 [152];
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  undefined4 local_28;
  undefined4 *local_18;
  long local_10;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  printf("\n");
  printf("LZHAM simple memory to memory compression test\n");
  memset(&local_34,0,0x1c);
  local_34 = 0x1c;
  local_30 = local_18[1];
  local_2c = *local_18;
  local_28 = 1;
  local_440 = 0x400;
  local_448 = 
  "This is a test.This is a test.This is a test.1234567This is a test.This is a test.123456";
  local_450 = strlen(
                    "This is a test.This is a test.This is a test.1234567This is a test.This is a test.123456"
                    );
  local_454 = 0;
  local_458 = (**(code **)(local_10 + 0x30))
                        (&local_34,local_438,&local_440,local_448,local_450,&local_454);
  if (local_458 == 2) {
    printf("Uncompressed size: %u\nCompressed size: %u\n",local_450 & 0xffffffff,
           local_440 & 0xffffffff);
    memset(&local_468,0,0x10);
    local_468 = 0x10;
    local_464 = local_18[1];
    local_45c = (uint)(*(byte *)(local_18 + 2) & 1);
    local_870 = 0x400;
    local_874 = 0;
    uVar1 = (**(code **)(local_10 + 0x50))
                      (&local_468,local_868,&local_870,local_438,local_440,&local_874);
    if (uVar1 == 2) {
      if (((local_454 == local_874) && (local_870 == local_450)) &&
         (iVar2 = memcmp(local_868,local_448,local_450), iVar2 == 0)) {
        printf("Compression test succeeded.\n");
        return 0;
      }
      print_error("Compression test failed!\n");
    }
    else {
      print_error("Compression test failed with status %i!\n",(ulong)uVar1);
    }
  }
  else {
    print_error("Compression test failed with status %i!\n",(ulong)local_458);
  }
  return 1;
}

Assistant:

static int simple_test(ilzham &lzham_dll, const comp_options &options)
{
   printf("\n");
   printf("LZHAM simple memory to memory compression test\n");

   lzham_compress_params comp_params;
   memset(&comp_params, 0, sizeof(comp_params));
   comp_params.m_struct_size = sizeof(comp_params);
   comp_params.m_dict_size_log2 = options.m_dict_size_log2;
   comp_params.m_level = options.m_comp_level;
   comp_params.m_max_helper_threads = 1;

   lzham_uint8 cmp_buf[1024];
   size_t cmp_len = sizeof(cmp_buf);

   const char *p = "This is a test.This is a test.This is a test.1234567This is a test.This is a test.123456";
   size_t uncomp_len = strlen(p);

   lzham_uint32 comp_adler32 = 0;
   lzham_compress_status_t comp_status = lzham_dll.lzham_compress_memory(&comp_params, cmp_buf, &cmp_len, (const lzham_uint8 *)p, uncomp_len, &comp_adler32);
   if (comp_status != LZHAM_COMP_STATUS_SUCCESS)
   {
      print_error("Compression test failed with status %i!\n", comp_status);
      return EXIT_FAILURE;
   }

   printf("Uncompressed size: %u\nCompressed size: %u\n", (uint)uncomp_len, (uint)cmp_len);

   lzham_decompress_params decomp_params;
   memset(&decomp_params, 0, sizeof(decomp_params));
   decomp_params.m_struct_size = sizeof(decomp_params);
   decomp_params.m_dict_size_log2 = options.m_dict_size_log2;
   decomp_params.m_compute_adler32 = options.m_compute_adler32_during_decomp;

   lzham_uint8 decomp_buf[1024];
   size_t decomp_size = sizeof(decomp_buf);
   lzham_uint32 decomp_adler32 = 0;
   lzham_decompress_status_t decomp_status = lzham_dll.lzham_decompress_memory(&decomp_params, decomp_buf, &decomp_size, cmp_buf, cmp_len, &decomp_adler32);
   if (decomp_status != LZHAM_DECOMP_STATUS_SUCCESS)
   {
      print_error("Compression test failed with status %i!\n", decomp_status);
      return EXIT_FAILURE;
   }

   if ((comp_adler32 != decomp_adler32) || (decomp_size != uncomp_len) || (memcmp(decomp_buf, p, uncomp_len)))
   {
      print_error("Compression test failed!\n");
      return EXIT_FAILURE;
   }

   printf("Compression test succeeded.\n");

   return EXIT_SUCCESS;
}